

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.cpp
# Opt level: O0

Variant * Jinx::operator%(Variant *__return_storage_ptr__,Variant *left,Variant *right)

{
  ValueType VVar1;
  int64_t iVar2;
  int64_t iVar3;
  double dVar4;
  double __y;
  int64_t r;
  int64_t l;
  double r_1;
  double l_1;
  Variant *right_local;
  Variant *left_local;
  
  VVar1 = Variant::GetType(left);
  if ((VVar1 == Number) || (VVar1 = Variant::GetType(right), VVar1 == Number)) {
    dVar4 = Variant::GetNumber(left);
    __y = Variant::GetNumber(right);
    dVar4 = fmod(dVar4,__y);
    dVar4 = fmod(dVar4 + __y,__y);
    Variant::Variant(__return_storage_ptr__,dVar4);
    return __return_storage_ptr__;
  }
  VVar1 = Variant::GetType(left);
  if (VVar1 != Integer) {
    Impl::LogWriteLine(Error,"Invalid left operand for mod");
    Variant::Variant(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  VVar1 = Variant::GetType(right);
  if (VVar1 != Integer) {
    Impl::LogWriteLine(Error,"Invalid right operand for mod");
    Variant::Variant(__return_storage_ptr__);
    return __return_storage_ptr__;
  }
  iVar2 = Variant::GetInteger(left);
  iVar3 = Variant::GetInteger(right);
  Variant::Variant(__return_storage_ptr__,(iVar2 % iVar3 + iVar3) % iVar3);
  return __return_storage_ptr__;
}

Assistant:

inline_t Variant operator % (const Variant & left, const Variant & right)
	{
		// Handle floating-point numbers with fmod function
		if (left.GetType() == ValueType::Number || right.GetType() == ValueType::Number)
		{
			auto l = left.GetNumber();
			auto r = right.GetNumber();
			return fmod(fmod(l, r) + r, r);
		}

		// Check for non-integer types, especially since co-erced right values will be zero
		if (left.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid left operand for mod");
			return Variant();
		}
		if (right.GetType() != ValueType::Integer)
		{
			Impl::LogWriteLine(LogLevel::Error, "Invalid right operand for mod");
			return Variant();
		}

		// Return result from integer mod operation
		auto l = left.GetInteger();
		auto r = right.GetInteger();
		return ((l % r) + r) % r;
	}